

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O1

string * __thiscall
duckdb::StringUtil::
Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_7)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_4_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_5_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_6_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> params_7_00;
  _Alloc_hider _Var2;
  undefined1 in_stack_fffffffffffffed8 [24];
  _Alloc_hider _Var3;
  undefined1 in_stack_fffffffffffffef8 [24];
  _Alloc_hider _Var4;
  undefined1 in_stack_ffffffffffffff18 [24];
  string local_d0;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar1 = (fmt_str->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar1,pcVar1 + fmt_str->_M_string_length);
  _Var4._M_p = &stack0xffffffffffffff20;
  pcVar1 = (params->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffff10,pcVar1,pcVar1 + params->_M_string_length);
  _Var3._M_p = &stack0xffffffffffffff00;
  pcVar1 = (params_1->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffef0,pcVar1,pcVar1 + params_1->_M_string_length);
  _Var2._M_p = &stack0xfffffffffffffee0;
  pcVar1 = (params_2->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xfffffffffffffed0,pcVar1,pcVar1 + params_2->_M_string_length);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (params_3->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + params_3->_M_string_length);
  local_90[0] = local_80;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,*(long *)params_4._M_dataplus._M_p,
             *(long *)(params_4._M_dataplus._M_p + 8) + *(long *)params_4._M_dataplus._M_p);
  local_b0[0] = local_a0;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_b0,*(long *)params_4._M_string_length,
             *(long *)(params_4._M_string_length + 8) + *(long *)params_4._M_string_length);
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,*(long *)params_4.field_2._M_allocated_capacity,
             *(long *)(params_4.field_2._M_allocated_capacity + 8) +
             *(long *)params_4.field_2._M_allocated_capacity);
  params_4_00._M_string_length = (size_type)local_b0;
  params_4_00._M_dataplus._M_p = (pointer)local_90;
  params_4_00.field_2._M_allocated_capacity = (size_type)local_50;
  params_4_00.field_2._8_8_ = __return_storage_ptr__;
  params_5_00._M_string_length = in_stack_fffffffffffffed8._0_8_;
  params_5_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffed8._8_16_;
  params_5_00._M_dataplus._M_p = _Var2._M_p;
  params_6_00._M_string_length = in_stack_fffffffffffffef8._0_8_;
  params_6_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffffef8._8_16_;
  params_6_00._M_dataplus._M_p = _Var3._M_p;
  params_7_00._M_string_length = in_stack_ffffffffffffff18._0_8_;
  params_7_00.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_ffffffffffffff18._8_16_;
  params_7_00._M_dataplus._M_p = _Var4._M_p;
  Exception::
  ConstructMessage<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(Exception *)this,&local_d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xffffffffffffff10,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffef0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffed0,&local_70,params_4_00,params_5_00,params_6_00,params_7_00);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (_Var2._M_p != &stack0xfffffffffffffee0) {
    operator_delete(_Var2._M_p);
  }
  if (_Var3._M_p != &stack0xffffffffffffff00) {
    operator_delete(_Var3._M_p);
  }
  if (_Var4._M_p != &stack0xffffffffffffff20) {
    operator_delete(_Var4._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}